

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QPixmapCache::Key>::emplace<QPixmapCache::Key_const&>
          (QMovableArrayOps<QPixmapCache::Key> *this,qsizetype i,Key *args)

{
  qsizetype *pqVar1;
  Key **ppKVar2;
  Data *pDVar3;
  long lVar4;
  Key *pKVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Key tmp;
  Inserter local_58;
  Key local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
           super_QArrayDataPointer<QPixmapCache::Key>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002b7bea:
    local_30.d = (KeyData *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmapCache::Key::Key(&local_30,args);
    bVar6 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
            super_QArrayDataPointer<QPixmapCache::Key>.size != 0;
    QArrayDataPointer<QPixmapCache::Key>::detachAndGrow
              ((QArrayDataPointer<QPixmapCache::Key> *)this,(uint)(i == 0 && bVar6),1,(Key **)0x0,
               (QArrayDataPointer<QPixmapCache::Key> *)0x0);
    if (i == 0 && bVar6) {
      pKVar5 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
               super_QArrayDataPointer<QPixmapCache::Key>.ptr;
      pKVar5[-1].d = local_30.d;
      local_30.d = (KeyData *)0x0;
      (this->super_QGenericArrayOps<QPixmapCache::Key>).super_QArrayDataPointer<QPixmapCache::Key>.
      ptr = pKVar5 + -1;
      pqVar1 = &(this->super_QGenericArrayOps<QPixmapCache::Key>).
                super_QArrayDataPointer<QPixmapCache::Key>.size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_58.displaceTo =
           (this->super_QGenericArrayOps<QPixmapCache::Key>).
           super_QArrayDataPointer<QPixmapCache::Key>.ptr;
      local_58.displaceFrom = local_58.displaceTo + i;
      local_58.displaceTo = local_58.displaceTo + i + 1;
      local_58.nInserts = 1;
      local_58.bytes =
           ((this->super_QGenericArrayOps<QPixmapCache::Key>).
            super_QArrayDataPointer<QPixmapCache::Key>.size - i) * 8;
      local_58.data = (QArrayDataPointer<QPixmapCache::Key> *)this;
      memmove(local_58.displaceTo,local_58.displaceFrom,local_58.bytes);
      (local_58.displaceFrom)->d = local_30.d;
      local_30.d = (KeyData *)0x0;
      local_58.displaceFrom = local_58.displaceFrom + 1;
      Inserter::~Inserter(&local_58);
    }
    QPixmapCache::Key::~Key(&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
            super_QArrayDataPointer<QPixmapCache::Key>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QPixmapCache::Key>).
                      super_QArrayDataPointer<QPixmapCache::Key>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QPixmapCache::Key::Key
                ((this->super_QGenericArrayOps<QPixmapCache::Key>).
                 super_QArrayDataPointer<QPixmapCache::Key>.ptr + lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((Key *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QPixmapCache::Key>).
          super_QArrayDataPointer<QPixmapCache::Key>.ptr)) goto LAB_002b7bea;
      QPixmapCache::Key::Key
                ((this->super_QGenericArrayOps<QPixmapCache::Key>).
                 super_QArrayDataPointer<QPixmapCache::Key>.ptr + -1,args);
      ppKVar2 = &(this->super_QGenericArrayOps<QPixmapCache::Key>).
                 super_QArrayDataPointer<QPixmapCache::Key>.ptr;
      *ppKVar2 = *ppKVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QPixmapCache::Key>).
              super_QArrayDataPointer<QPixmapCache::Key>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }